

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O3

DOHcode rdata(uchar *doh,size_t dohlen,unsigned_short rdlength,unsigned_short type,int index,
             dohentry *d)

{
  anon_union_16_2_f9ece763_for_ip *paVar1;
  byte bVar2;
  undefined8 uVar3;
  DOHcode DVar4;
  long lVar5;
  int iVar6;
  undefined6 in_register_0000000a;
  cnamestore *c;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  bool bVar10;
  
  uVar8 = (ulong)(uint)index;
  iVar6 = (int)CONCAT62(in_register_0000000a,type);
  if (iVar6 == 0x1c) {
    if (rdlength != 0x10) {
      return DOH_DNS_RDATA_LEN;
    }
    lVar5 = (long)d->numaddr;
    if (lVar5 < 0x18) {
      d->addr[lVar5].type = 0x1c;
      uVar3 = *(undefined8 *)(doh + index + 8);
      paVar1 = &d->addr[lVar5].ip;
      *(undefined8 *)paVar1 = *(undefined8 *)(doh + index);
      *(undefined8 *)((long)paVar1 + 8) = uVar3;
      d->numaddr = d->numaddr + 1;
    }
  }
  else if (iVar6 == 5) {
    iVar6 = d->numcname;
    if ((long)iVar6 != 4) {
      d->numcname = iVar6 + 1;
      c = d->cname + iVar6;
      iVar6 = -0x7f;
      do {
        if (dohlen <= uVar8) {
          return DOH_DNS_OUT_OF_RANGE;
        }
        bVar2 = doh[uVar8];
        uVar7 = (uint)bVar2;
        if ((bVar2 & 0xc0) == 0) {
          if (uVar7 == 0) {
            return DOH_OK;
          }
          if ((c->len != 0) && (DVar4 = cnameappend(c,".",1), DVar4 != DOH_OK)) {
            return DVar4;
          }
          uVar9 = (int)uVar8 + 1;
          uVar8 = (ulong)(uVar9 + uVar7);
          if (dohlen < uVar8) {
            return DOH_DNS_BAD_LABEL;
          }
          DVar4 = cnameappend(c,doh + uVar9,(ulong)uVar7);
          if (DVar4 != DOH_OK) {
            return DVar4;
          }
        }
        else {
          if ((bVar2 & 0xc0) != 0xc0) {
            return DOH_DNS_BAD_LABEL;
          }
          uVar8 = (ulong)((int)uVar8 + 1);
          if (dohlen <= uVar8) {
            return DOH_DNS_OUT_OF_RANGE;
          }
          uVar8 = (ulong)((uint)doh[uVar8] | (uVar7 & 0x3f) << 8);
        }
        if ((uVar7 == 0) || (bVar10 = iVar6 == 0, iVar6 = iVar6 + 1, bVar10)) {
          return (uint)(bVar2 != 0) * 3;
        }
      } while( true );
    }
  }
  else if (iVar6 == 1) {
    if (rdlength != 4) {
      return DOH_DNS_RDATA_LEN;
    }
    iVar6 = d->numaddr;
    lVar5 = (long)iVar6;
    if (lVar5 < 0x18) {
      d->addr[lVar5].type = 1;
      *(undefined4 *)&d->addr[lVar5].ip = *(undefined4 *)(doh + index);
      d->numaddr = iVar6 + 1;
    }
  }
  return DOH_OK;
}

Assistant:

static DOHcode rdata(unsigned char *doh,
                     size_t dohlen,
                     unsigned short rdlength,
                     unsigned short type,
                     int index,
                     struct dohentry *d)
{
  /* RDATA
     - A (TYPE 1):  4 bytes
     - AAAA (TYPE 28): 16 bytes
     - NS (TYPE 2): N bytes */
  DOHcode rc;

  switch(type) {
  case DNS_TYPE_A:
    if(rdlength != 4)
      return DOH_DNS_RDATA_LEN;
    rc = store_a(doh, index, d);
    if(rc)
      return rc;
    break;
  case DNS_TYPE_AAAA:
    if(rdlength != 16)
      return DOH_DNS_RDATA_LEN;
    rc = store_aaaa(doh, index, d);
    if(rc)
      return rc;
    break;
  case DNS_TYPE_CNAME:
    rc = store_cname(doh, dohlen, index, d);
    if(rc)
      return rc;
    break;
  default:
    /* unsupported type, just skip it */
    break;
  }
  return DOH_OK;
}